

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationDataBuilder::buildContext
          (CollationDataBuilder *this,ConditionalCE32 *head,UErrorCode *errorCode)

{
  UVector *this_00;
  short sVar1;
  Normalizer2Impl *pNVar2;
  uint uVar3;
  bool bVar4;
  uint32_t uVar5;
  UBool UVar6;
  uint16_t uVar7;
  int32_t iVar8;
  int iVar9;
  UChar32 UVar10;
  int32_t iVar11;
  ConditionalCE32 *pCVar12;
  ConditionalCE32 *pCVar13;
  ConditionalCE32 *this_01;
  ushort uVar14;
  int srcLength;
  uint32_t defaultCE32;
  ConditionalCE32 *pCVar15;
  undefined4 uVar16;
  uint uVar17;
  bool bVar18;
  uint local_1c8;
  UnicodeString prefix;
  UCharsTrieBuilder contractionBuilder;
  UnicodeString suffix;
  UCharsTrieBuilder prefixBuilder;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  UCharsTrieBuilder::UCharsTrieBuilder(&prefixBuilder,errorCode);
  UCharsTrieBuilder::UCharsTrieBuilder(&contractionBuilder,errorCode);
  this_00 = &this->conditionalCE32s;
  this_01 = head;
  do {
    iVar8 = ConditionalCE32::prefixLength(this_01);
    srcLength = iVar8 + 1;
    UnicodeString::UnicodeString(&prefix,&this_01->context,0,srcLength);
    pCVar12 = this_01;
    do {
      pCVar15 = pCVar12;
      if (pCVar15->next < 0) break;
      pCVar12 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar15->next);
      UVar6 = UnicodeString::startsWith(&pCVar12->context,&prefix);
    } while (UVar6 != '\0');
    sVar1 = (pCVar15->context).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar9 = (pCVar15->context).fUnion.fFields.fLength;
    }
    else {
      iVar9 = (int)sVar1 >> 5;
    }
    if (iVar9 == srcLength) {
      uVar17 = pCVar15->ce32;
      pCVar13 = pCVar15;
LAB_00231810:
      this_01->defaultCE32 = uVar17;
      if (iVar8 == 0) {
        if (-1 < pCVar13->next) goto LAB_00231a3f;
        bVar18 = false;
        bVar4 = false;
        local_1c8 = uVar17;
      }
      else {
        UnicodeString::remove(&prefix,(char *)0x0);
        UnicodeString::reverse(&prefix);
        UCharsTrieBuilder::add(&prefixBuilder,&prefix,uVar17,errorCode);
        if (pCVar13->next < 0) {
          bVar4 = true;
          bVar18 = false;
        }
        else {
LAB_00231a3f:
          bVar18 = true;
          bVar4 = false;
        }
      }
    }
    else {
      uVar14 = contractionBuilder.strings.fUnion.fStackFields.fLengthAndFlags & 0x1e;
      if ((contractionBuilder.strings.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
        uVar14 = 2;
      }
      contractionBuilder.elementsLength = 0;
      contractionBuilder.ucharsLength = 0;
      sVar1 = (this_01->context).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar9 = (this_01->context).fUnion.fFields.fLength;
      }
      else {
        iVar9 = (int)sVar1 >> 5;
      }
      contractionBuilder.strings.fUnion.fStackFields.fLengthAndFlags = uVar14;
      if (iVar9 == srcLength) {
        defaultCE32 = this_01->ce32;
        pCVar12 = (ConditionalCE32 *)UVector::elementAt(this_00,this_01->next);
        uVar17 = 0x200;
      }
      else {
        defaultCE32 = 0;
        pCVar12 = head;
        while (iVar11 = ConditionalCE32::prefixLength(pCVar12), iVar11 != iVar8) {
          uVar5 = defaultCE32;
          if (((pCVar12->defaultCE32 != 1) && (uVar5 = pCVar12->defaultCE32, iVar11 != 0)) &&
             (UVar6 = UnicodeString::endsWith(&prefix,&pCVar12->context,1,iVar11),
             uVar5 = defaultCE32, UVar6 != '\0')) {
            uVar5 = pCVar12->defaultCE32;
          }
          defaultCE32 = uVar5;
          pCVar12 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar12->next);
        }
        uVar17 = 0x300;
        pCVar12 = this_01;
      }
      do {
        UnicodeString::UnicodeString(&suffix,&pCVar12->context,srcLength);
        pNVar2 = this->nfcImpl;
        UVar10 = UnicodeString::char32At(&suffix,0);
        uVar7 = Normalizer2Impl::getFCD16(pNVar2,UVar10);
        uVar3 = uVar17 & 0xfffffdff;
        if (0xff < uVar7) {
          uVar3 = uVar17;
        }
        uVar16 = suffix.fUnion.fFields.fLength;
        if (-1 < suffix.fUnion.fStackFields.fLengthAndFlags) {
          uVar16 = (int)suffix.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        pNVar2 = this->nfcImpl;
        UVar10 = UnicodeString::char32At(&suffix,uVar16 + -1);
        uVar7 = Normalizer2Impl::getFCD16(pNVar2,UVar10);
        uVar17 = uVar3 | 0x400;
        if (uVar7 < 0x100) {
          uVar17 = uVar3;
        }
        UCharsTrieBuilder::add(&contractionBuilder,&suffix,pCVar12->ce32,errorCode);
        pCVar13 = pCVar12;
        if (pCVar12 != pCVar15) {
          pCVar13 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar12->next);
        }
        UnicodeString::~UnicodeString(&suffix);
        bVar18 = pCVar12 != pCVar15;
        pCVar12 = pCVar13;
      } while (bVar18);
      iVar11 = addContextTrie(this,defaultCE32,&contractionBuilder,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (iVar11 < 0x80000) {
          uVar17 = uVar17 | iVar11 << 0xd | 0xc9;
          goto LAB_00231810;
        }
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      bVar18 = false;
      bVar4 = false;
      local_1c8 = 0;
    }
    UnicodeString::~UnicodeString(&prefix);
    if (!bVar18) {
      if (bVar4) {
        iVar8 = addContextTrie(this,head->defaultCE32,&prefixBuilder,errorCode);
        local_1c8 = 0;
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          if (iVar8 < 0x80000) {
            local_1c8 = iVar8 << 0xd | 200;
          }
          else {
            *errorCode = U_BUFFER_OVERFLOW_ERROR;
          }
        }
      }
      UCharsTrieBuilder::~UCharsTrieBuilder(&contractionBuilder);
      UCharsTrieBuilder::~UCharsTrieBuilder(&prefixBuilder);
      return local_1c8;
    }
    this_01 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar13->next);
  } while( true );
}

Assistant:

uint32_t
CollationDataBuilder::buildContext(ConditionalCE32 *head, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    // The list head must have no context.
    U_ASSERT(!head->hasContext());
    // The list head must be followed by one or more nodes that all do have context.
    U_ASSERT(head->next >= 0);
    UCharsTrieBuilder prefixBuilder(errorCode);
    UCharsTrieBuilder contractionBuilder(errorCode);
    for(ConditionalCE32 *cond = head;; cond = getConditionalCE32(cond->next)) {
        // After the list head, the prefix or suffix can be empty, but not both.
        U_ASSERT(cond == head || cond->hasContext());
        int32_t prefixLength = cond->prefixLength();
        UnicodeString prefix(cond->context, 0, prefixLength + 1);
        // Collect all contraction suffixes for one prefix.
        ConditionalCE32 *firstCond = cond;
        ConditionalCE32 *lastCond = cond;
        while(cond->next >= 0 &&
                (cond = getConditionalCE32(cond->next))->context.startsWith(prefix)) {
            lastCond = cond;
        }
        uint32_t ce32;
        int32_t suffixStart = prefixLength + 1;  // == prefix.length()
        if(lastCond->context.length() == suffixStart) {
            // One prefix without contraction suffix.
            U_ASSERT(firstCond == lastCond);
            ce32 = lastCond->ce32;
            cond = lastCond;
        } else {
            // Build the contractions trie.
            contractionBuilder.clear();
            // Entry for an empty suffix, to be stored before the trie.
            uint32_t emptySuffixCE32 = 0;
            uint32_t flags = 0;
            if(firstCond->context.length() == suffixStart) {
                // There is a mapping for the prefix and the single character c. (p|c)
                // If no other suffix matches, then we return this value.
                emptySuffixCE32 = firstCond->ce32;
                cond = getConditionalCE32(firstCond->next);
            } else {
                // There is no mapping for the prefix and just the single character.
                // (There is no p|c, only p|cd, p|ce etc.)
                flags |= Collation::CONTRACT_SINGLE_CP_NO_MATCH;
                // When the prefix matches but none of the prefix-specific suffixes,
                // then we fall back to the mappings with the next-longest prefix,
                // and ultimately to mappings with no prefix.
                // Each fallback might be another set of contractions.
                // For example, if there are mappings for ch, p|cd, p|ce, but not for p|c,
                // then in text "pch" we find the ch contraction.
                for(cond = head;; cond = getConditionalCE32(cond->next)) {
                    int32_t length = cond->prefixLength();
                    if(length == prefixLength) { break; }
                    if(cond->defaultCE32 != Collation::NO_CE32 &&
                            (length==0 || prefix.endsWith(cond->context, 1, length))) {
                        emptySuffixCE32 = cond->defaultCE32;
                    }
                }
                cond = firstCond;
            }
            // Optimization: Set a flag when
            // the first character of every contraction suffix has lccc!=0.
            // Short-circuits contraction matching when a normal letter follows.
            flags |= Collation::CONTRACT_NEXT_CCC;
            // Add all of the non-empty suffixes into the contraction trie.
            for(;;) {
                UnicodeString suffix(cond->context, suffixStart);
                uint16_t fcd16 = nfcImpl.getFCD16(suffix.char32At(0));
                if(fcd16 <= 0xff) {
                    flags &= ~Collation::CONTRACT_NEXT_CCC;
                }
                fcd16 = nfcImpl.getFCD16(suffix.char32At(suffix.length() - 1));
                if(fcd16 > 0xff) {
                    // The last suffix character has lccc!=0, allowing for discontiguous contractions.
                    flags |= Collation::CONTRACT_TRAILING_CCC;
                }
                contractionBuilder.add(suffix, (int32_t)cond->ce32, errorCode);
                if(cond == lastCond) { break; }
                cond = getConditionalCE32(cond->next);
            }
            int32_t index = addContextTrie(emptySuffixCE32, contractionBuilder, errorCode);
            if(U_FAILURE(errorCode)) { return 0; }
            if(index > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return 0;
            }
            ce32 = Collation::makeCE32FromTagAndIndex(Collation::CONTRACTION_TAG, index) | flags;
        }
        U_ASSERT(cond == lastCond);
        firstCond->defaultCE32 = ce32;
        if(prefixLength == 0) {
            if(cond->next < 0) {
                // No non-empty prefixes, only contractions.
                return ce32;
            }
        } else {
            prefix.remove(0, 1);  // Remove the length unit.
            prefix.reverse();
            prefixBuilder.add(prefix, (int32_t)ce32, errorCode);
            if(cond->next < 0) { break; }
        }
    }
    U_ASSERT(head->defaultCE32 != Collation::NO_CE32);
    int32_t index = addContextTrie(head->defaultCE32, prefixBuilder, errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    if(index > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    return Collation::makeCE32FromTagAndIndex(Collation::PREFIX_TAG, index);
}